

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_residual.c
# Opt level: O1

int h264_residual_cavlc(bitstream *str,h264_slice *slice,int32_t *block,int *num,int cat,int idx,
                       int start,int end,int maxnumcoeff)

{
  int iVar1;
  int32_t *__s;
  bitstream *pbVar2;
  uint32_t tzVlcIndex;
  int iVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint32_t uVar10;
  uint32_t *puVar11;
  uint32_t *puVar12;
  long lVar13;
  uint32_t *puVar14;
  ulong uVar15;
  long lVar16;
  bool bVar17;
  uint32_t auStack_90 [2];
  uint32_t auStack_88 [2];
  uint *local_80;
  long local_78;
  int32_t *local_70;
  h264_slice *local_68;
  uint local_5c;
  bitstream *pbStack_58;
  uint32_t s;
  uint32_t *local_50;
  uint32_t *local_48;
  int local_40;
  uint32_t local_3c;
  uint32_t local_38;
  uint32_t local_34;
  uint32_t trailing_ones;
  uint32_t total_coeff;
  
  uVar4 = (ulong)(uint)maxnumcoeff * 4 + 0xf & 0xfffffffffffffff0;
  lVar16 = (long)auStack_88 - uVar4;
  puVar11 = (uint32_t *)(lVar16 - uVar4);
  local_80 = (uint *)num;
  if (str->dir == VS_ENCODE) {
    local_34 = 0;
    local_38 = 0;
    local_68 = slice;
    pbStack_58 = str;
    local_40 = cat;
    if (0 < maxnumcoeff) {
      uVar6 = 0;
      uVar8 = 0;
      uVar4 = 0;
      do {
        if (block[uVar4] != 0) {
          if (((long)uVar4 < (long)start) || ((long)end < (long)uVar4)) {
            local_50 = auStack_88;
            local_48 = puVar11;
            puVar11[-2] = 0x104be7;
            puVar11[-1] = 0;
            h264_residual_cavlc_cold_1();
            return 1;
          }
          uVar6 = uVar6 + 1;
          if ((block[uVar4] + 1U & 0xfffffffd) != 0) {
            uVar6 = 0;
          }
          local_3c = ((int)uVar4 - start) - uVar8;
          uVar8 = uVar8 + 1;
          local_38 = uVar6;
          local_34 = uVar8;
        }
        uVar4 = uVar4 + 1;
      } while ((uint)maxnumcoeff != uVar4);
    }
    local_50 = auStack_88;
    local_48 = puVar11;
    if (0 < maxnumcoeff) {
      iVar3 = local_34 - 1;
      uVar6 = start - 1;
      uVar4 = 0;
      local_50 = auStack_88;
      do {
        iVar7 = block[uVar4];
        if (iVar7 != 0) {
          uVar8 = ~uVar6;
          uVar6 = (uint)uVar4;
          puVar11[iVar3] = uVar8 + uVar6;
          *(int *)(lVar16 + (long)iVar3 * 4) = iVar7;
          iVar3 = iVar3 + -1;
        }
        uVar4 = uVar4 + 1;
      } while ((uint)maxnumcoeff != uVar4);
    }
    slice = local_68;
    str = pbStack_58;
    if (3 < local_38) {
      local_38 = 3;
    }
  }
  local_78 = lVar16;
  local_70 = block;
  puVar11[-2] = 0x104964;
  puVar11[-1] = 0;
  iVar3 = h264_coeff_token(str,slice,cat,idx,&local_38,&local_34);
  lVar16 = local_78;
  iVar7 = 1;
  if (iVar3 == 0) {
    local_40 = cat;
    local_68 = slice;
    pbStack_58 = str;
    if (local_80 != (uint *)0x0) {
      *local_80 = local_34;
    }
    puVar12 = puVar11;
    if (local_34 != 0) {
      puVar14 = auStack_88;
      if (local_34 != 0) {
        uVar6 = (uint)(local_38 < 3 && 10 < local_34);
        lVar13 = 0;
        uVar4 = 0;
        local_50 = auStack_88;
        local_48 = puVar11;
        do {
          pbVar2 = pbStack_58;
          uVar15 = (ulong)local_38;
          if (uVar4 < uVar15) {
            local_5c = *(uint *)(lVar16 + uVar4 * 4) >> 0x1f;
            puVar11[-2] = 0x104a0e;
            puVar11[-1] = 0;
            iVar3 = vs_u(pbVar2,&local_5c,1);
            if (iVar3 != 0) {
              return 1;
            }
            *(uint *)(lVar16 + uVar4 * 4) = local_5c * -2 + 1;
          }
          else {
            bVar17 = local_38 < 3;
            puVar11[-2] = 0x104a46;
            puVar11[-1] = 0;
            iVar3 = h264_level(pbVar2,uVar6,(uint)(bVar17 && uVar4 == uVar15),
                               (int32_t *)(lVar16 + lVar13));
            if (iVar3 == 0) {
              iVar9 = uVar6 + (uVar6 == 0);
              iVar7 = *(int *)(lVar16 + uVar4 * 4);
              iVar1 = -iVar7;
              if (0 < iVar7) {
                iVar1 = iVar7;
              }
              uVar6 = (uint)(iVar9 < 6 && 3 << ((char)iVar9 - 1U & 0x1f) < iVar1) + iVar9;
            }
            if (iVar3 != 0) {
              return 1;
            }
          }
          uVar4 = uVar4 + 1;
          lVar13 = lVar13 + 4;
          puVar12 = local_48;
          puVar14 = local_50;
        } while (uVar4 < local_34);
      }
      tzVlcIndex = local_34;
      pbVar2 = pbStack_58;
      uVar10 = 0;
      if (local_40 == 3) {
        uVar10 = local_68->chroma_array_type;
      }
      if (local_34 < (end - start) + 1U) {
        puVar11[-2] = 0x104ad4;
        puVar11[-1] = 0;
        iVar3 = h264_total_zeros(pbVar2,uVar10,tzVlcIndex,&local_3c);
      }
      else {
        puVar11[-2] = 0x104ae5;
        puVar11[-1] = 0;
        iVar3 = vs_infer(pbVar2,&local_3c,0);
      }
      if (iVar3 != 0) {
        return 1;
      }
      local_48 = puVar12;
      local_50 = puVar14;
      uVar4 = (ulong)(local_34 - 1);
      bVar17 = local_34 - 1 != 0;
      uVar10 = local_3c;
      if (bVar17) {
        uVar15 = 0;
        do {
          pbVar2 = pbStack_58;
          puVar11[-2] = 0x104b24;
          puVar11[-1] = 0;
          iVar3 = h264_run_before(pbVar2,uVar10,puVar12);
          if (iVar3 != 0) goto LAB_00104b63;
          uVar10 = uVar10 - *puVar12;
          if ((int)uVar10 < 0) {
            puVar11[-2] = 0x104bfa;
            puVar11[-1] = 0;
            h264_residual_cavlc_cold_2();
            goto LAB_00104b63;
          }
          uVar15 = uVar15 + 1;
          uVar4 = (ulong)(local_34 - 1);
          puVar12 = puVar12 + 1;
          bVar17 = uVar15 < uVar4;
        } while (bVar17);
      }
      local_48[uVar4] = uVar10;
LAB_00104b63:
      puVar12 = local_48;
      if (bVar17) {
        return 1;
      }
    }
    __s = local_70;
    iVar7 = 0;
    if (pbStack_58->dir == VS_DECODE) {
      if (0 < maxnumcoeff) {
        puVar11[-2] = 0x104b9e;
        puVar11[-1] = 0;
        memset(__s,0,(ulong)(uint)maxnumcoeff << 2);
      }
      iVar7 = 0;
      if (-1 < (int)(local_34 - 1)) {
        iVar3 = -1;
        lVar13 = (ulong)(local_34 - 1) + 1;
        do {
          iVar7 = iVar3 + puVar12[lVar13 + -1];
          iVar3 = iVar3 + puVar12[lVar13 + -1] + 1;
          __s[iVar7 + start + 1] = *(int32_t *)(lVar16 + -4 + lVar13 * 4);
          lVar5 = lVar13 + -1;
          bVar17 = 0 < lVar13;
          lVar13 = lVar5;
        } while (lVar5 != 0 && bVar17);
        iVar7 = 0;
      }
    }
  }
  return iVar7;
}

Assistant:

int h264_residual_cavlc(struct bitstream *str, struct h264_slice *slice, int32_t *block, int *num, int cat, int idx, int start, int end, int maxnumcoeff) {
	uint32_t total_coeff, trailing_ones;
	int i, j;
	int32_t tb[maxnumcoeff];
	uint32_t run[maxnumcoeff];
	int last;
	uint32_t total_zeros;
	if (str->dir == VS_ENCODE) {
		total_coeff = 0;
		trailing_ones = 0;
		for (i = 0; i < maxnumcoeff; i++)
			if (block[i]) {
				if (i < start || i > end) {
					fprintf(stderr, "Non-zero coord outside of start..end\n");
					return 1;
				}
				total_coeff++;
				if (abs(block[i]) == 1)
					trailing_ones++;
				else
					trailing_ones = 0;
				total_zeros = i + 1 - total_coeff - start;
			}
		last = start - 1;
		for (i = 0, j = total_coeff - 1; i < maxnumcoeff; i++) {
			if (block[i]) {
				run[j] = i - last - 1;
				tb[j] = block[i];
				last = i;
				j--;
			}
		}
		if (trailing_ones > 3)
			trailing_ones = 3;
	}
	if (h264_coeff_token(str, slice, cat, idx, &trailing_ones, &total_coeff)) return 1;
	if (num)
		*num = total_coeff;
	if (total_coeff) {
		int suffixLength;
		if (total_coeff > 10 && trailing_ones < 3)
			suffixLength = 1;
		else
			suffixLength = 0;
		for (i = 0; i < total_coeff; i++) {
			if (i < trailing_ones) {
				uint32_t s = tb[i] < 0;
				if (vs_u(str, &s, 1)) return 1;
				tb[i] = 1 - 2 * s;
			} else {
				int onebias = (i == trailing_ones && trailing_ones < 3);
				if (h264_level(str, suffixLength, onebias, &tb[i])) return 1;
				if (suffixLength == 0)
					suffixLength = 1;
				if (abs(tb[i]) > (3 << (suffixLength - 1)) && suffixLength < 6)
					suffixLength++;
			}
		}
		int mode;
		if (cat == H264_CTXBLOCKCAT_CHROMA_DC) {
			mode = slice->chroma_array_type;
		} else {
			mode = 0;
		}
		if (total_coeff < end - start + 1) {
			if (h264_total_zeros(str, mode, total_coeff, &total_zeros)) return 1;
		} else {
			if (vs_infer(str, &total_zeros, 0)) return 1;
		}
		int zerosLeft = total_zeros;
		for (i = 0; i < total_coeff - 1; i++) {
			if (h264_run_before(str, zerosLeft, &run[i])) return 1;
			zerosLeft -= run[i];
			if (zerosLeft < 0) {
				fprintf(stderr, "zerosLeft underflow\n");
				return 1;
			}
		}
		run[total_coeff-1] = zerosLeft;
	}
	if (str->dir == VS_DECODE) {
		for (i = 0; i < maxnumcoeff; i++)
			block[i] = 0;
		for (i = total_coeff - 1, j = -1; i >= 0; i--) {
			j += run[i] + 1;
			block[start + j] = tb[i];
		}
	}
	return 0;
}